

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall
TestNLHandler::OnComplementarity(TestNLHandler *this,int con_index,int var_index,ComplInfo info)

{
  Writer *this_00;
  int local_20;
  int local_1c;
  double local_18;
  double local_10;
  
  local_20 = var_index;
  local_1c = con_index;
  this_00 = WriteSep(this);
  local_10 = 0.0;
  local_18 = 0.0;
  if ((info.flags_ & 2U) != 0) {
    local_18 = -INFINITY;
  }
  if ((info.flags_ & 1U) != 0) {
    local_10 = INFINITY;
  }
  fmt::BasicWriter<char>::write<double,int,double,int>
            (this_00,(BasicCStringRef<char>)0x21c21b,&local_18,&local_1c,&local_10,&local_20);
  return;
}

Assistant:

void OnComplementarity(int con_index, int var_index, mp::ComplInfo info) {
    WriteSep().write("{} <= c{} <= {} complements v{};",
                     info.con_lb(), con_index, info.con_ub(), var_index);
  }